

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_unnest.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownUnnest
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined8 uVar2;
  FilterResult FVar3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  pointer pLVar4;
  LogicalUnnest *pLVar5;
  type pFVar6;
  reference pvVar7;
  __node_base *p_Var8;
  pointer in_RDX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var9;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  remain_expressions;
  FilterPushdown child_pushdown;
  undefined1 local_1b0 [40];
  __buckets_ptr local_188;
  size_type sStack_180;
  __node_base local_178;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_170
  ;
  __buckets_ptr local_168;
  size_type sStack_160;
  _Hash_node_base *local_158;
  FilterPushdown local_150;
  
  local_1b0._32_8_ = in_RDX;
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_RDX);
  pLVar5 = LogicalOperator::Cast<duckdb::LogicalUnnest>(pLVar4);
  FilterPushdown(&local_150,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_178._M_nxt = (_Hash_node_base *)0x0;
  local_188 = (__buckets_ptr)0x0;
  sStack_180 = 0;
  _Var9._M_head_impl =
       op[0x21].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       op[0x22].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_170 = op;
  do {
    if (_Var9._M_head_impl == _Var1._M_head_impl) {
      GenerateFilters(&local_150);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._32_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar4->children,0);
      local_1b0._24_8_ =
           (pvVar7->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar7->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Rewrite((FilterPushdown *)local_1b0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)&local_150);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._32_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar4->children,0);
      uVar2 = local_1b0._0_8_;
      local_1b0._0_8_ = (Optimizer *)0x0;
      _Var9._M_head_impl =
           (pvVar7->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar7->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar2;
      if (_Var9._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var9._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if ((Optimizer *)local_1b0._0_8_ != (Optimizer *)0x0) {
        (*(code *)((*(ClientContext **)local_1b0._0_8_)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_1b0._0_8_ = (LogicalOperator *)0x0;
      if ((LogicalOperator *)local_1b0._24_8_ != (LogicalOperator *)0x0) {
        (*(*(_func_int ***)local_1b0._24_8_)[1])();
      }
      local_1b0._24_8_ = (pointer)0x0;
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._32_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar4->children,0);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar7);
      if (pLVar4->type == LOGICAL_EMPTY_RESULT) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)local_1b0,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_1b0._32_8_);
LAB_01a775cf:
        this->optimizer = (Optimizer *)local_1b0._0_8_;
      }
      else {
        local_1b0._16_8_ =
             ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
             &(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
               local_1b0._32_8_)->_M_t).
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>)->_M_head_impl;
        ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
        &(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
          local_1b0._32_8_)->_M_t).
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>)->_M_head_impl = (LogicalOperator *)0x0;
        local_168 = local_188;
        sStack_160 = sStack_180;
        local_158 = local_178._M_nxt;
        local_188 = (__buckets_ptr)0x0;
        sStack_180 = 0;
        local_178._M_nxt = (_Hash_node_base *)0x0;
        AddLogicalFilter(this,local_170,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(local_1b0 + 0x10));
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_168);
        if ((LogicalOperator *)local_1b0._16_8_ != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)local_1b0._16_8_)[1])();
        }
        local_1b0._16_8_ = (pointer)0x0;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_188);
      ~FilterPushdown(&local_150);
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             this;
    }
    pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator*((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                          *)_Var9._M_head_impl);
    p_Var8 = &(pFVar6->bindings)._M_h._M_before_begin;
    do {
      p_Var8 = p_Var8->_M_nxt;
      if (p_Var8 == (__node_base *)0x0) {
        local_1b0._8_8_ =
             (pFVar6->filter).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pFVar6->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        FVar3 = AddFilter(&local_150,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)(local_1b0 + 8));
        if ((ClientContext *)local_1b0._8_8_ != (ClientContext *)0x0) {
          (**(code **)((long)((BaseExpression *)local_1b0._8_8_)->_vptr_BaseExpression + 8))();
        }
        local_1b0._8_8_ = (ClientContext *)0x0;
        if (FVar3 != UNSATISFIABLE) goto LAB_01a77484;
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)local_1b0,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_1b0._32_8_);
        goto LAB_01a775cf;
      }
    } while (p_Var8[1]._M_nxt != (_Hash_node_base *)pLVar5->unnest_index);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_188,&pFVar6->filter);
LAB_01a77484:
    _Var9._M_head_impl = (LogicalOperator *)&(_Var9._M_head_impl)->type;
  } while( true );
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownUnnest(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_UNNEST);
	auto &unnest = op->Cast<LogicalUnnest>();
	// push filter through logical projection
	// all the BoundColumnRefExpressions in the filter should refer to the LogicalProjection
	// we can rewrite them by replacing those references with the expression of the LogicalProjection node
	FilterPushdown child_pushdown(optimizer, convert_mark_joins);
	// There are some expressions can not be pushed down. We should keep them
	// and add an extra filter operator.
	vector<unique_ptr<Expression>> remain_expressions;
	for (auto &filter : filters) {
		auto &f = *filter;
		auto can_push = true;
		for (auto &binding : f.bindings) {
			if (binding == unnest.unnest_index) {
				can_push = false;
				break;
			}
		}
		// if the expression index table index is the unnest index, then the filter is on the
		// unnest, and it should not be pushed down.
		if (!can_push) {
			// We can't push down related expressions if the column in the
			// expression is generated by the functions which have side effects
			remain_expressions.push_back(std::move(f.filter));
		} else {
			// add the filter to the child pushdown
			if (child_pushdown.AddFilter(std::move(f.filter)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	child_pushdown.GenerateFilters();
	// now push into children
	op->children[0] = child_pushdown.Rewrite(std::move(op->children[0]));
	if (op->children[0]->type == LogicalOperatorType::LOGICAL_EMPTY_RESULT) {
		// child returns an empty result: generate an empty result here too
		return make_uniq<LogicalEmptyResult>(std::move(op));
	}
	return AddLogicalFilter(std::move(op), std::move(remain_expressions));
}